

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::isVarCanBeNull(Analyzer *this,Node *node)

{
  Node *b;
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  if (node == (Node *)0x0) {
    return false;
  }
  bVar1 = true;
  if (node->nodeType != PNT_NULL) {
    uVar2 = ((long)nearest_assignments.
                   super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)nearest_assignments.
                  super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    lVar3 = (uVar2 & 0xffffffff) * 0x18;
    for (; 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      b = *(Node **)((long)&nearest_assignments.
                            super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar3);
      if ((b != (Node *)0x0) && (bVar1 = isNodeEquals(this,node,b), bVar1)) {
        return *(int *)(*(long *)((long)nearest_assignments.
                                        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x10) +
                       0x10) == 1;
      }
      lVar3 = lVar3 + -0x18;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isVarCanBeNull(Node * node)
  {
    if (!node)
      return false;

    if (node->nodeType == PNT_NULL)
      return true;

    for (int i = int(nearest_assignments.size()) - 1; i >= 0; i--)
      if (nearest_assignments[i].first && isNodeEquals(node, nearest_assignments[i].first))
      {
        if (nearest_assignments[i].second.first->nodeType == PNT_NULL)
          return true;
        break;
      }

    return false;
  }